

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void P_PredictPlayer(player_t *player)

{
  APlayerPawn *pmo;
  short sVar1;
  short sVar2;
  short sVar3;
  undefined2 uVar4;
  double dVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  ticcmd_t *ptVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  PredictPos *local_128;
  bool local_f2;
  bool local_f1;
  PredictPos local_f0;
  PredictPos local_b0;
  DVector3 local_70;
  uint local_58;
  byte local_53;
  bool local_52;
  bool local_51;
  int i;
  bool NoInterpolateOld;
  bool DoLerp;
  bool CanLerp;
  FBlockNode *block;
  AActor *link;
  msecnode_t *local_38;
  msecnode_t *snode;
  msecnode_t *mnode;
  APlayerPawn *local_20;
  APlayerPawn *act;
  player_t *ppStack_10;
  int maxtic;
  player_t *player_local;
  
  ppStack_10 = player;
  bVar6 = FBoolCVar::operator_cast_to_bool(&cl_noprediction);
  if (((((!bVar6) && ((singletics & 1U) == 0)) && ((demoplayback & 1U) == 0)) &&
      (((ppStack_10->mo != (APlayerPawn *)0x0 &&
        (ppStack_10 == (player_t *)(&players + (long)consoleplayer * 0x54))) &&
       ((ppStack_10->playerstate == '\0' &&
        (((netgame & 1U) != 0 && ((ppStack_10->cheats & 0x2000U) == 0)))))))) &&
     (act._4_4_ = maketic, gametic != maketic)) {
    player_t::operator=(&PredictionPlayerBackup,ppStack_10);
    local_20 = ppStack_10->mo;
    memcpy(PredictionActorBackup,&(local_20->super_AActor).snext,0x508);
    operator~((int)&mnode + MF_SHOOTABLE);
    TFlags<ActorFlag,_unsigned_int>::operator&=
              (&(local_20->super_AActor).flags,(Self *)((long)&mnode + 4));
    operator~((EnumType)&mnode);
    TFlags<ActorFlag2,_unsigned_int>::operator&=(&(local_20->super_AActor).flags2,(Self *)&mnode);
    ppStack_10->cheats = ppStack_10->cheats | 0x2000;
    snode = (local_20->super_AActor).touching_sectorlist;
    TArray<msecnode_t_*,_msecnode_t_*>::Clear(&PredictionSector_sprev_Backup);
    TArray<sector_t_*,_sector_t_*>::Clear(&PredictionTouchingSectorsBackup);
    for (; snode != (msecnode_t *)0x0; snode = snode->m_tnext) {
      TArray<sector_t_*,_sector_t_*>::Push(&PredictionTouchingSectorsBackup,&snode->m_sector);
      for (local_38 = snode->m_sector->touching_thinglist; local_38 != (msecnode_t *)0x0;
          local_38 = local_38->m_snext) {
        if ((APlayerPawn *)local_38->m_thing == local_20) {
          TArray<msecnode_t_*,_msecnode_t_*>::Push
                    (&PredictionSector_sprev_Backup,&local_38->m_sprev);
          break;
        }
      }
    }
    TArray<AActor_*,_AActor_*>::Clear(&PredictionSectorListBackup);
    TFlags<ActorFlag,_unsigned_int>::operator&
              ((TFlags<ActorFlag,_unsigned_int> *)((long)&link + 4),
               (int)local_20 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar7 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&link + 4));
    if (uVar7 == 0) {
      for (block = (FBlockNode *)((local_20->super_AActor).Sector)->thinglist;
          block != (FBlockNode *)0x0; block = *(FBlockNode **)&block[1].BlockIndex) {
        TArray<AActor_*,_AActor_*>::Push(&PredictionSectorListBackup,(AActor **)&block);
      }
    }
    for (_i = (local_20->super_AActor).BlockNode; _i != (FBlockNode *)0x0; _i = _i->NextBlock) {
      if (_i->NextActor != (FBlockNode *)0x0) {
        _i->NextActor->PrevActor = _i->PrevActor;
      }
      *_i->PrevActor = _i->NextActor;
    }
    (local_20->super_AActor).BlockNode = (FBlockNode *)0x0;
    fVar11 = FFloatCVar::operator_cast_to_float(&cl_predict_lerpscale);
    local_f1 = 0.01 <= fVar11 && ticdup == 1;
    local_51 = local_f1;
    local_52 = false;
    local_53 = R_GetViewInterpolationStatus();
    for (local_58 = gametic; (int)local_58 < act._4_4_; local_58 = local_58 + 1) {
      if ((local_53 & 1) == 0) {
        R_RebuildViewInterpolation(ppStack_10);
      }
      iVar10 = (int)local_58 % 0xb4;
      ptVar9 = localcmds + iVar10;
      sVar1 = (ptVar9->ucmd).pitch;
      sVar2 = (ptVar9->ucmd).yaw;
      (ppStack_10->cmd).ucmd.buttons = (ptVar9->ucmd).buttons;
      (ppStack_10->cmd).ucmd.pitch = sVar1;
      (ppStack_10->cmd).ucmd.yaw = sVar2;
      ptVar9 = localcmds + iVar10;
      sVar1 = (ptVar9->ucmd).forwardmove;
      sVar2 = (ptVar9->ucmd).sidemove;
      sVar3 = (ptVar9->ucmd).upmove;
      (ppStack_10->cmd).ucmd.roll = (ptVar9->ucmd).roll;
      (ppStack_10->cmd).ucmd.forwardmove = sVar1;
      (ppStack_10->cmd).ucmd.sidemove = sVar2;
      (ppStack_10->cmd).ucmd.upmove = sVar3;
      uVar4 = *(undefined2 *)&localcmds[iVar10].field_0x12;
      (ppStack_10->cmd).consistancy = localcmds[iVar10].consistancy;
      *(undefined2 *)&(ppStack_10->cmd).field_0x12 = uVar4;
      P_PlayerThink(ppStack_10);
      (*(ppStack_10->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[7])();
      if (((((local_51 & 1U) != 0) && (0 < PredictionLast.gametic)) &&
          (local_58 == PredictionLast.gametic)) && ((local_53 & 1) == 0)) {
        iVar10 = (int)PredictionLast.pos.X;
        dVar13 = AActor::X(&ppStack_10->mo->super_AActor);
        local_f2 = true;
        if (iVar10 == (int)dVar13) {
          iVar10 = (int)PredictionLast.pos.Y;
          dVar13 = AActor::Y(&ppStack_10->mo->super_AActor);
          local_f2 = iVar10 != (int)dVar13;
        }
        local_52 = local_f2;
        iVar8 = FIntCVar::operator_cast_to_int(&developer);
        uVar7 = local_58;
        dVar13 = PredictionLast.pos.X;
        iVar10 = PredictionLast.gametic;
        if ((2 < iVar8) && ((local_52 & 1U) != 0)) {
          dVar14 = AActor::X(&ppStack_10->mo->super_AActor);
          dVar5 = PredictionLast.pos.Y;
          dVar15 = AActor::Y(&ppStack_10->mo->super_AActor);
          DPrintf(3,"Lerp! Ltic (%d) && Ptic (%d) | Lx (%f) && Px (%f) | Ly (%f) && Py (%f)\n",
                  dVar13,dVar14,dVar5,SUB84(dVar15,0),(ulong)(uint)iVar10,(ulong)uVar7);
        }
      }
    }
    if ((local_51 & 1U) != 0) {
      if ((local_53 & 1) == 0) {
        if ((local_52 & 1U) != 0) {
          if (PredictionLerptics == 0) {
            local_128 = &PredictionLast;
          }
          else {
            local_128 = &PredictionLerpResult;
          }
          PredictPos::operator=(&PredictionLerpFrom,local_128);
          PredictionLerptics = 1;
        }
      }
      else {
        P_PredictionLerpReset();
      }
      PredictionLast.gametic = act._4_4_ + -1;
      AActor::Pos(&local_70,&ppStack_10->mo->super_AActor);
      TVector3<double>::operator=(&PredictionLast.pos,&local_70);
      if (0 < PredictionLerptics) {
        if (0 < PredictionLerpFrom.gametic) {
          pmo = ppStack_10->mo;
          PredictPos::PredictPos(&local_b0,&PredictionLerpFrom);
          PredictPos::PredictPos(&local_f0,&PredictionLast);
          fVar11 = (float)PredictionLerptics;
          fVar12 = FFloatCVar::operator_cast_to_float(&cl_predict_lerpscale);
          bVar6 = P_LerpCalculate(&pmo->super_AActor,&local_b0,&local_f0,&PredictionLerpResult,
                                  fVar11 * fVar12);
          if (bVar6) {
            PredictionLerptics = PredictionLerptics + 1;
            AActor::SetXYZ(&ppStack_10->mo->super_AActor,&PredictionLerpResult.pos);
            return;
          }
        }
        PredictionLerptics = 0;
      }
    }
  }
  return;
}

Assistant:

void P_PredictPlayer (player_t *player)
{
	int maxtic;

	if (cl_noprediction ||
		singletics ||
		demoplayback ||
		player->mo == NULL ||
		player != &players[consoleplayer] ||
		player->playerstate != PST_LIVE ||
		!netgame ||
		/*player->morphTics ||*/
		(player->cheats & CF_PREDICTING))
	{
		return;
	}

	maxtic = maketic;

	if (gametic == maxtic)
	{
		return;
	}

	// Save original values for restoration later
	PredictionPlayerBackup = *player;

	APlayerPawn *act = player->mo;
	memcpy(PredictionActorBackup, &act->snext, sizeof(APlayerPawn) - ((BYTE *)&act->snext - (BYTE *)act));

	act->flags &= ~MF_PICKUP;
	act->flags2 &= ~MF2_PUSHWALL;
	player->cheats |= CF_PREDICTING;

	// The ordering of the touching_sectorlist needs to remain unchanged
	// Also store a copy of all previous sector_thinglist nodes
	msecnode_t *mnode = act->touching_sectorlist;
	msecnode_t *snode;
	PredictionSector_sprev_Backup.Clear();
	PredictionTouchingSectorsBackup.Clear ();

	while (mnode != NULL)
	{
		PredictionTouchingSectorsBackup.Push (mnode->m_sector);

		for (snode = mnode->m_sector->touching_thinglist; snode; snode = snode->m_snext)
		{
			if (snode->m_thing == act)
			{
				PredictionSector_sprev_Backup.Push(snode->m_sprev);
				break;
			}
		}

		mnode = mnode->m_tnext;
	}

	// Keep an ordered list off all actors in the linked sector.
	PredictionSectorListBackup.Clear();
	if (!(act->flags & MF_NOSECTOR))
	{
		AActor *link = act->Sector->thinglist;
		
		while (link != NULL)
		{
			PredictionSectorListBackup.Push(link);
			link = link->snext;
		}
	}

	// Blockmap ordering also needs to stay the same, so unlink the block nodes
	// without releasing them. (They will be used again in P_UnpredictPlayer).
	FBlockNode *block = act->BlockNode;

	while (block != NULL)
	{
		if (block->NextActor != NULL)
		{
			block->NextActor->PrevActor = block->PrevActor;
		}
		*(block->PrevActor) = block->NextActor;
		block = block->NextBlock;
	}
	act->BlockNode = NULL;

	// Values too small to be usable for lerping can be considered "off".
	bool CanLerp = (!(cl_predict_lerpscale < 0.01f) && (ticdup == 1)), DoLerp = false, NoInterpolateOld = R_GetViewInterpolationStatus();
	for (int i = gametic; i < maxtic; ++i)
	{
		if (!NoInterpolateOld)
			R_RebuildViewInterpolation(player);

		player->cmd = localcmds[i % LOCALCMDTICS];
		P_PlayerThink (player);
		player->mo->Tick ();

		if (CanLerp && PredictionLast.gametic > 0 && i == PredictionLast.gametic && !NoInterpolateOld)
		{
			// Z is not compared as lifts will alter this with no apparent change
			// Make lerping less picky by only testing whole units
			DoLerp = (int)PredictionLast.pos.X != (int)player->mo->X() || (int)PredictionLast.pos.Y != (int)player->mo->Y();

			// Aditional Debug information
			if (developer >= DMSG_NOTIFY && DoLerp)
			{
				DPrintf(DMSG_NOTIFY, "Lerp! Ltic (%d) && Ptic (%d) | Lx (%f) && Px (%f) | Ly (%f) && Py (%f)\n",
					PredictionLast.gametic, i,
					(PredictionLast.pos.X), (player->mo->X()),
					(PredictionLast.pos.Y), (player->mo->Y()));
			}
		}
	}

	if (CanLerp)
	{
		if (NoInterpolateOld)
			P_PredictionLerpReset();

		else if (DoLerp)
		{
			// If lerping is already in effect, use the previous camera postion so the view doesn't suddenly snap
			PredictionLerpFrom = (PredictionLerptics == 0) ? PredictionLast : PredictionLerpResult;
			PredictionLerptics = 1;
		}

		PredictionLast.gametic = maxtic - 1;
		PredictionLast.pos = player->mo->Pos();
		//PredictionLast.portalgroup = player->mo->Sector->PortalGroup;

		if (PredictionLerptics > 0)
		{
			if (PredictionLerpFrom.gametic > 0 &&
				P_LerpCalculate(player->mo, PredictionLerpFrom, PredictionLast, PredictionLerpResult, (float)PredictionLerptics * cl_predict_lerpscale))
			{
				PredictionLerptics++;
				player->mo->SetXYZ(PredictionLerpResult.pos);
			}
			else
			{
				PredictionLerptics = 0;
			}
		}
	}
}